

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O1

void Imf_2_5::loadDeepImage(string *fileName,Header *hdr,DeepImage *img)

{
  char *fileName_00;
  bool bVar1;
  int iVar2;
  Header *pHVar3;
  string *name;
  ostream *poVar4;
  ArgExc *pAVar5;
  bool tiled;
  bool multiPart;
  bool deep;
  stringstream _iex_throw_s;
  bool local_1b3;
  bool local_1b2;
  bool local_1b1;
  MultiPartInputFile local_1b0;
  ostream local_1a0 [376];
  
  bVar1 = isOpenExrFile((fileName->_M_dataplus)._M_p,&local_1b3,&local_1b1,&local_1b2);
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Cannot load image file ",0x17);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,".  The file is not an OpenEXR file.",0x23);
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar5,(stringstream *)&local_1b0);
    __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (local_1b2 == true) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Cannot load image file ",0x17);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,".  Multi-part file loading is not supported.",0x2c);
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar5,(stringstream *)&local_1b0);
    __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (local_1b1 == false) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"Cannot load flat image file ",0x1c);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," as a deep image.",0x11);
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar5,(stringstream *)&local_1b0);
    __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  fileName_00 = (fileName->_M_dataplus)._M_p;
  iVar2 = globalThreadCount();
  MultiPartInputFile::MultiPartInputFile(&local_1b0,fileName_00,iVar2,true);
  iVar2 = MultiPartInputFile::parts(&local_1b0);
  if (0 < iVar2) {
    pHVar3 = MultiPartInputFile::header(&local_1b0,0);
    bVar1 = Header::hasType(pHVar3);
    if (bVar1) {
      pHVar3 = MultiPartInputFile::header(&local_1b0,0);
      name = Header::type_abi_cxx11_(pHVar3);
      local_1b3 = isTiled(name);
      goto LAB_0011fba1;
    }
  }
  local_1b3 = false;
LAB_0011fba1:
  MultiPartInputFile::~MultiPartInputFile(&local_1b0);
  if (local_1b3 == true) {
    loadDeepTiledImage(fileName,hdr,img);
  }
  else {
    loadDeepScanLineImage(fileName,hdr,img);
  }
  return;
}

Assistant:

void
loadDeepImage
    (const string &fileName,
     Header &hdr,
     DeepImage &img)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str(), tiled, deep, multiPart))
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "Multi-part file loading is not supported.");
    }

    if (!deep)
    {
        THROW (ArgExc, "Cannot load flat image file " << fileName << " "
                       "as a deep image.");
    }

    //XXX TODO: the tiled flag obtained above is unreliable;
    // open the file as a multi-part file and inspect the header.
    // Can the IlmImf library be fixed?

    {
        MultiPartInputFile mpi (fileName.c_str());

        tiled = (mpi.parts() > 0 &&
                 mpi.header(0).hasType() &&
                 isTiled (mpi.header(0).type()));
    }

    if (tiled)
        loadDeepTiledImage (fileName, hdr, img);
    else
        loadDeepScanLineImage (fileName, hdr, img);
}